

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeModel::timerEvent(QTreeModel *this,QTimerEvent *ev)

{
  int iVar1;
  int iVar2;
  QTimerEvent *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = QTimerEvent::timerId((QTimerEvent *)0x9122f6);
  iVar2 = QBasicTimer::timerId((QBasicTimer *)0x912308);
  if (iVar1 == iVar2) {
    executePendingSort((QTreeModel *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  else {
    QObject::timerEvent(in_RDI);
  }
  return;
}

Assistant:

void QTreeModel::timerEvent(QTimerEvent *ev)
{
    if (ev->timerId() == sortPendingTimer.timerId()) {
        executePendingSort();
    } else {
        QAbstractItemModel::timerEvent(ev);
    }
}